

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_horz_only_frame_superres_test.cc
# Opt level: O2

void anon_unknown.dwarf_1f38a46::PrepBuffers<unsigned_char>
               (ACMRandom *rnd,int w,int h,int stride,int bd,bool trash_edges,uchar *data)

{
  uint16_t uVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  size_t __n;
  uchar *puVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  
  FillEdge<unsigned_char>(rnd,stride << 5,bd,trash_edges,data);
  uVar3 = 0;
  uVar8 = 0;
  if (0 < w) {
    uVar8 = (ulong)(uint)w;
  }
  lVar4 = (long)stride;
  uVar2 = 0;
  if (0 < h) {
    uVar2 = (ulong)(uint)h;
  }
  puVar5 = data + lVar4 * 0x20 + 0x20;
  for (; uVar3 != uVar2; uVar3 = uVar3 + 1) {
    lVar7 = (uVar3 + 0x20) * lVar4;
    FillEdge<unsigned_char>(rnd,0x20,bd,trash_edges,data + lVar7);
    for (uVar6 = 0; uVar8 != uVar6; uVar6 = uVar6 + 1) {
      uVar1 = libaom_test::ACMRandom::Rand16(rnd);
      puVar5[uVar6] = (byte)uVar1 & ~(byte)(-1 << ((byte)bd & 0x1f));
    }
    FillEdge<unsigned_char>(rnd,0x20,bd,trash_edges,data + (long)w + lVar7 + 0x20);
    puVar5 = puVar5 + lVar4;
  }
  FillEdge<unsigned_char>(rnd,stride << 5,bd,trash_edges,data + (h + 0x20) * stride);
  __n = (size_t)((h + 0x40) * stride);
  memcpy(data + __n,data,__n);
  return;
}

Assistant:

void PrepBuffers(ACMRandom *rnd, int w, int h, int stride, int bd,
                 bool trash_edges, Pixel *data) {
  assert(rnd);
  const Pixel mask = (1 << bd) - 1;

  // Fill in the first buffer with random data
  // Top border
  FillEdge(rnd, stride * kVPad, bd, trash_edges, data);
  for (int r = 0; r < h; ++r) {
    Pixel *row_data = data + (kVPad + r) * stride;
    // Left border, contents, right border
    FillEdge(rnd, kHPad, bd, trash_edges, row_data);
    for (int c = 0; c < w; ++c) row_data[kHPad + c] = rnd->Rand16() & mask;
    FillEdge(rnd, kHPad, bd, trash_edges, row_data + kHPad + w);
  }
  // Bottom border
  FillEdge(rnd, stride * kVPad, bd, trash_edges, data + stride * (kVPad + h));

  const int bpp = sizeof(*data);
  const int block_elts = stride * (h + 2 * kVPad);
  const int block_size = bpp * block_elts;

  // Now copy that to the second buffer
  memcpy(data + block_elts, data, block_size);
}